

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_skip(void)

{
  byte bVar1;
  int32_t iVar2;
  bson_type_t bVar3;
  bson_type_t bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar9;
  bson_t *bcon;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar5 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(10);
  uVar5 = bcon_new(0,"hello","world","foo","{","bar",uVar5,CONCAT44(uVar8,0xf),CONCAT44(uVar9,iVar2)
                   ,"}",0);
  uVar6 = bson_bcone_magic();
  bVar3 = bcon_ensure_bson_type(BSON_TYPE_UTF8);
  uVar7 = bson_bcone_magic();
  bVar4 = bcon_ensure_bson_type(BSON_TYPE_INT32);
  bVar1 = bcon_extract(uVar5,"hello",uVar6,0x1c,bVar3,"foo","{","bar",uVar7,0x1c,bVar4,"}",0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1c5,"test_skip",
            "BCON_EXTRACT (bcon, \"hello\", BCONE_SKIP (BSON_TYPE_UTF8), \"foo\", \"{\", \"bar\", BCONE_SKIP (BSON_TYPE_INT32), \"}\")"
           );
    abort();
  }
  uVar6 = bson_bcone_magic();
  bVar3 = bcon_ensure_bson_type(BSON_TYPE_UTF8);
  uVar7 = bson_bcone_magic();
  bVar4 = bcon_ensure_bson_type(BSON_TYPE_INT64);
  bVar1 = bcon_extract(uVar5,"hello",uVar6,0x1c,bVar3,"foo","{","bar",uVar7,0x1c,bVar4,"}",0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1ce,"test_skip",
            "!BCON_EXTRACT (bcon, \"hello\", BCONE_SKIP (BSON_TYPE_UTF8), \"foo\", \"{\", \"bar\", BCONE_SKIP (BSON_TYPE_INT64), \"}\")"
           );
    abort();
  }
  bson_destroy(uVar5);
  return;
}

Assistant:

static void
test_skip (void)
{
   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_SKIP (BSON_TYPE_UTF8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_SKIP (BSON_TYPE_INT32),
                         "}"));

   BSON_ASSERT (!BCON_EXTRACT (bcon,
                          "hello",
                          BCONE_SKIP (BSON_TYPE_UTF8),
                          "foo",
                          "{",
                          "bar",
                          BCONE_SKIP (BSON_TYPE_INT64),
                          "}"));

   bson_destroy (bcon);
}